

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_char(lua_State *L)

{
  char *pcVar1;
  ulong uVar2;
  lua_Unsigned c;
  char *p;
  luaL_Buffer b;
  int i;
  int n;
  lua_State *L_local;
  
  b.init._1020_4_ = lua_gettop(L);
  pcVar1 = luaL_buffinitsize(L,(luaL_Buffer *)&p,(ulong)(uint)b.init._1020_4_);
  for (b.init._1016_4_ = 1; (int)b.init._1016_4_ <= (int)b.init._1020_4_;
      b.init._1016_4_ = b.init._1016_4_ + 1) {
    uVar2 = luaL_checkinteger(L,b.init._1016_4_);
    if (0xff < uVar2) {
      luaL_argerror(L,b.init._1016_4_,"value out of range");
    }
    pcVar1[b.init._1016_4_ + -1] = (char)uVar2;
  }
  luaL_pushresultsize((luaL_Buffer *)&p,(ulong)(uint)b.init._1020_4_);
  return 1;
}

Assistant:

static int str_char (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  int i;
  luaL_Buffer b;
  char *p = luaL_buffinitsize(L, &b, cast_uint(n));
  for (i=1; i<=n; i++) {
    lua_Unsigned c = (lua_Unsigned)luaL_checkinteger(L, i);
    luaL_argcheck(L, c <= (lua_Unsigned)UCHAR_MAX, i, "value out of range");
    p[i - 1] = cast_char(cast_uchar(c));
  }
  luaL_pushresultsize(&b, cast_uint(n));
  return 1;
}